

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

size_t __thiscall
clog::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
size(BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this)

{
  size_type sVar1;
  
  std::mutex::lock(&this->_mutex);
  sVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->_queue);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar1;
}

Assistant:

size_t size() const 
    {
        MutexLockGuard lock(_mutex);
        return _queue.size();
    }